

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbering.h
# Opt level: O0

void __thiscall wasm::ValueNumbering::~ValueNumbering(ValueNumbering *this)

{
  ValueNumbering *this_local;
  
  std::
  unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
  ::~unordered_map(&this->expressionValues);
  std::
  unordered_map<wasm::Literals,_unsigned_int,_std::hash<wasm::Literals>,_std::equal_to<wasm::Literals>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>_>
  ::~unordered_map(&this->literalValues);
  return;
}

Assistant:

Index getValue(Expression* expr) {
    if (Properties::isConstantExpression(expr)) {
      return getValue(Properties::getLiterals(expr));
    } else {
      auto iter = expressionValues.find(expr);
      if (iter != expressionValues.end()) {
        return iter->second;
      }
      // TODO: full GVN to check for different expressions with the same value.
      return expressionValues[expr] = getUniqueValue();
    }
  }